

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Mat *pMVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Mat *m;
  Mat *pMVar12;
  uint uVar13;
  __m128 *pafVar14;
  int iVar15;
  uint uVar16;
  Option *opt_00;
  undefined1 (*pauVar17) [16];
  float *pfVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  undefined1 (*pauVar23) [16];
  float fVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  __m128 afVar34;
  binary_op_ratan2 op;
  __m128 _b;
  binary_op_ratan2 local_9d;
  int local_9c;
  long local_98;
  long local_90;
  __m128 local_88;
  Mat *local_78;
  Mat *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58 [2];
  float afStack_50 [2];
  undefined1 local_48 [16];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar12 = pMVar4 + 1;
  iVar15 = pMVar4[1].h * pMVar4[1].w * pMVar4[1].d * pMVar4[1].c * pMVar4[1].elempack;
  if ((pMVar4[1].dims <= pMVar4->dims) || (bVar5 = true, iVar15 == 1)) {
    bVar5 = pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar15;
  }
  uVar13 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]);
  m = pMVar4;
  if (((bVar5) && (uVar16 = uVar13 - 1, m = pMVar12, pMVar12 = pMVar4, uVar16 < 0xb)) &&
     ((0x7e5U >> (uVar16 & 0x1f) & 1) != 0)) {
    uVar13 = *(uint *)(&DAT_0059cda0 + (ulong)uVar16 * 4);
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar4,m,opt->blob_allocator);
  if (pMVar4->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar4->c * pMVar4->cstep == 0) {
    return -100;
  }
  iVar15 = pMVar12->elempack;
  iVar21 = pMVar12->w;
  iVar20 = pMVar12->h;
  iVar1 = pMVar12->d;
  iVar2 = pMVar12->c;
  if (iVar1 * iVar2 * iVar20 * iVar21 * iVar15 == 1) {
    if (0xb < uVar13) {
      return 0;
    }
    local_68 = *pMVar12->data;
    local_48 = ZEXT416((uint)local_68);
    local_78 = pMVar4;
    local_70 = m;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    switch(uVar13) {
    case 0:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pfVar18 = (float *)(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar23 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar25._0_4_ = *pfVar18 + local_68;
              auVar25._4_4_ = pfVar18[1] + local_68;
              auVar25._8_4_ = pfVar18[2] + local_68;
              auVar25._12_4_ = pfVar18[3] + local_68;
              *pauVar23 = auVar25;
              pfVar18 = pfVar18 + 4;
              pauVar23 = pauVar23 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              *(float *)((long)*pauVar23 + lVar19 * 4) = pfVar18[lVar19] + local_68;
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 1:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pfVar18 = (float *)(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar23 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar28._0_4_ = *pfVar18 - local_68;
              auVar28._4_4_ = pfVar18[1] - local_68;
              auVar28._8_4_ = pfVar18[2] - local_68;
              auVar28._12_4_ = pfVar18[3] - local_68;
              *pauVar23 = auVar28;
              pfVar18 = pfVar18 + 4;
              pauVar23 = pauVar23 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              *(float *)((long)*pauVar23 + lVar19 * 4) = pfVar18[lVar19] - local_68;
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 2:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pfVar18 = (float *)(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar23 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar26._0_4_ = *pfVar18 * local_68;
              auVar26._4_4_ = pfVar18[1] * local_68;
              auVar26._8_4_ = pfVar18[2] * local_68;
              auVar26._12_4_ = pfVar18[3] * local_68;
              *pauVar23 = auVar26;
              pfVar18 = pfVar18 + 4;
              pauVar23 = pauVar23 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              *(float *)((long)*pauVar23 + lVar19 * 4) = pfVar18[lVar19] * local_68;
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 3:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        local_68 = 1.0 / local_68;
        lVar22 = 0;
        do {
          pfVar18 = (float *)(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar23 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar30._0_4_ = *pfVar18 * local_68;
              auVar30._4_4_ = pfVar18[1] * local_68;
              auVar30._8_4_ = pfVar18[2] * local_68;
              auVar30._12_4_ = pfVar18[3] * local_68;
              *pauVar23 = auVar30;
              pfVar18 = pfVar18 + 4;
              pauVar23 = pauVar23 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              *(float *)((long)*pauVar23 + lVar19 * 4) = pfVar18[lVar19] * local_68;
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 4:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pauVar23 = (undefined1 (*) [16])(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar17 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar11._4_4_ = local_68;
              auVar11._0_4_ = local_68;
              auVar11._8_4_ = local_68;
              auVar11._12_4_ = local_68;
              auVar29 = maxps(*pauVar23,auVar11);
              *pauVar17 = auVar29;
              pauVar23 = pauVar23 + 1;
              pauVar17 = pauVar17 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              fVar24 = *(float *)(*pauVar23 + lVar19 * 4);
              if (*(float *)(*pauVar23 + lVar19 * 4) <= local_68) {
                fVar24 = local_68;
              }
              *(float *)((long)*pauVar17 + lVar19 * 4) = fVar24;
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 5:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pauVar23 = (undefined1 (*) [16])(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar17 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar10._4_4_ = local_68;
              auVar10._0_4_ = local_68;
              auVar10._8_4_ = local_68;
              auVar10._12_4_ = local_68;
              auVar29 = minps(*pauVar23,auVar10);
              *pauVar17 = auVar29;
              pauVar23 = pauVar23 + 1;
              pauVar17 = pauVar17 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              fVar24 = *(float *)(*pauVar23 + lVar19 * 4);
              if (local_68 <= *(float *)(*pauVar23 + lVar19 * 4)) {
                fVar24 = local_68;
              }
              *(float *)((long)*pauVar17 + lVar19 * 4) = fVar24;
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 6:
      local_98 = (long)m->c;
      if (0 < local_98) {
        local_9c = m->h * m->w * m->d * m->elempack;
        local_90 = 0;
        do {
          pafVar14 = (__m128 *)
                     (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
          pauVar23 = (undefined1 (*) [16])
                     (local_78->cstep * local_90 * local_78->elemsize + (long)local_78->data);
          local_58[1] = fStack_64;
          local_58[0] = local_68;
          afStack_50[1] = fStack_5c;
          afStack_50[0] = fStack_60;
          if (local_9c < 4) {
            iVar15 = 0;
          }
          else {
            iVar21 = 0;
            do {
              local_88 = *pafVar14;
              afVar34 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                  ((binary_op_pow *)&local_9d,&local_88,(__m128 *)local_58);
              uVar6 = afVar34._0_8_;
              local_88[2] = (float)extraout_XMM0_Dc_01;
              local_88[0] = (float)(int)uVar6;
              local_88[1] = (float)(int)((ulong)uVar6 >> 0x20);
              local_88[3] = extraout_XMM0_Dd_01;
              auVar9._8_4_ = extraout_XMM0_Dc_01;
              auVar9._0_8_ = uVar6;
              auVar9._12_4_ = extraout_XMM0_Dd_01;
              *pauVar23 = auVar9;
              pafVar14 = pafVar14 + 1;
              pauVar23 = pauVar23 + 1;
              iVar15 = iVar21 + 4;
              iVar20 = iVar21 + 7;
              iVar21 = iVar15;
            } while (iVar20 < local_9c);
          }
          iVar21 = local_9c - iVar15;
          if (iVar15 < local_9c) {
            lVar22 = 0;
            do {
              fVar24 = powf((*pafVar14)[lVar22],local_48._0_4_);
              *(float *)((long)*pauVar23 + lVar22 * 4) = fVar24;
              lVar22 = lVar22 + 1;
            } while (iVar21 != (int)lVar22);
          }
          local_90 = local_90 + 1;
        } while (local_90 != local_98);
      }
      break;
    case 7:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pfVar18 = (float *)(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pauVar23 = (undefined1 (*) [16])
                     (pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar27._0_4_ = local_68 - *pfVar18;
              auVar27._4_4_ = local_68 - pfVar18[1];
              auVar27._8_4_ = local_68 - pfVar18[2];
              auVar27._12_4_ = local_68 - pfVar18[3];
              *pauVar23 = auVar27;
              pfVar18 = pfVar18 + 4;
              pauVar23 = pauVar23 + 1;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              *(float *)((long)*pauVar23 + lVar19 * 4) = local_68 - pfVar18[lVar19];
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 8:
      iVar15 = m->c;
      if (0 < (long)iVar15) {
        uVar13 = m->h * m->w * m->d * m->elempack;
        lVar22 = 0;
        do {
          pauVar23 = (undefined1 (*) [16])(m->cstep * lVar22 * m->elemsize + (long)m->data);
          pfVar18 = (float *)(pMVar4->cstep * lVar22 * pMVar4->elemsize + (long)pMVar4->data);
          if ((int)uVar13 < 4) {
            uVar16 = 0;
          }
          else {
            iVar21 = 3;
            do {
              auVar29 = *pauVar23;
              in_XMM2 = rcpps(in_XMM2,auVar29);
              fVar24 = local_68 * in_XMM2._0_4_;
              fVar31 = local_68 * in_XMM2._4_4_;
              fVar32 = local_68 * in_XMM2._8_4_;
              fVar33 = local_68 * in_XMM2._12_4_;
              *pfVar18 = (local_68 - auVar29._0_4_ * fVar24) * in_XMM2._0_4_ + fVar24;
              pfVar18[1] = (local_68 - auVar29._4_4_ * fVar31) * in_XMM2._4_4_ + fVar31;
              pfVar18[2] = (local_68 - auVar29._8_4_ * fVar32) * in_XMM2._8_4_ + fVar32;
              pfVar18[3] = (local_68 - auVar29._12_4_ * fVar33) * in_XMM2._12_4_ + fVar33;
              pauVar23 = pauVar23 + 1;
              pfVar18 = pfVar18 + 4;
              iVar21 = iVar21 + 4;
              uVar16 = uVar13 & 0xfffffffc;
            } while (iVar21 < (int)uVar13);
          }
          if (uVar13 - uVar16 != 0 && (int)uVar16 <= (int)uVar13) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] = local_68 / *(float *)(*pauVar23 + lVar19 * 4);
              lVar19 = lVar19 + 1;
            } while (uVar13 - uVar16 != (int)lVar19);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar15);
      }
      break;
    case 9:
      local_98 = (long)m->c;
      if (0 < local_98) {
        local_9c = m->h * m->w * m->d * m->elempack;
        local_90 = 0;
        do {
          pafVar14 = (__m128 *)
                     (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
          pauVar23 = (undefined1 (*) [16])
                     (local_78->cstep * local_90 * local_78->elemsize + (long)local_78->data);
          local_58[1] = fStack_64;
          local_58[0] = local_68;
          afStack_50[1] = fStack_5c;
          afStack_50[0] = fStack_60;
          if (local_9c < 4) {
            iVar15 = 0;
          }
          else {
            iVar21 = 0;
            do {
              local_88 = *pafVar14;
              afVar34 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                  ((binary_op_rpow *)&local_9d,&local_88,(__m128 *)local_58);
              uVar6 = afVar34._0_8_;
              local_88[2] = (float)extraout_XMM0_Dc_00;
              local_88[0] = (float)(int)uVar6;
              local_88[1] = (float)(int)((ulong)uVar6 >> 0x20);
              local_88[3] = extraout_XMM0_Dd_00;
              auVar8._8_4_ = extraout_XMM0_Dc_00;
              auVar8._0_8_ = uVar6;
              auVar8._12_4_ = extraout_XMM0_Dd_00;
              *pauVar23 = auVar8;
              pafVar14 = pafVar14 + 1;
              pauVar23 = pauVar23 + 1;
              iVar15 = iVar21 + 4;
              iVar20 = iVar21 + 7;
              iVar21 = iVar15;
            } while (iVar20 < local_9c);
          }
          iVar21 = local_9c - iVar15;
          if (iVar15 < local_9c) {
            lVar22 = 0;
            do {
              fVar24 = powf((float)local_48._0_4_,(*pafVar14)[lVar22]);
              *(float *)((long)*pauVar23 + lVar22 * 4) = fVar24;
              lVar22 = lVar22 + 1;
            } while (iVar21 != (int)lVar22);
          }
          local_90 = local_90 + 1;
        } while (local_90 != local_98);
      }
      break;
    case 10:
      local_98 = (long)m->c;
      if (0 < local_98) {
        local_9c = m->h * m->w * m->d * m->elempack;
        local_90 = 0;
        do {
          pafVar14 = (__m128 *)
                     (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
          pauVar23 = (undefined1 (*) [16])
                     (local_78->cstep * local_90 * local_78->elemsize + (long)local_78->data);
          local_58[1] = fStack_64;
          local_58[0] = local_68;
          afStack_50[1] = fStack_5c;
          afStack_50[0] = fStack_60;
          if (local_9c < 4) {
            iVar15 = 0;
          }
          else {
            iVar21 = 0;
            do {
              local_88 = *pafVar14;
              afVar34 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                  ((binary_op_atan2 *)&local_9d,&local_88,(__m128 *)local_58);
              uVar6 = afVar34._0_8_;
              local_88[2] = (float)extraout_XMM0_Dc_02;
              local_88[0] = (float)(int)uVar6;
              local_88[1] = (float)(int)((ulong)uVar6 >> 0x20);
              local_88[3] = extraout_XMM0_Dd_02;
              auVar7._8_4_ = extraout_XMM0_Dc_02;
              auVar7._0_8_ = uVar6;
              auVar7._12_4_ = extraout_XMM0_Dd_02;
              *pauVar23 = auVar7;
              pafVar14 = pafVar14 + 1;
              pauVar23 = pauVar23 + 1;
              iVar15 = iVar21 + 4;
              iVar20 = iVar21 + 7;
              iVar21 = iVar15;
            } while (iVar20 < local_9c);
          }
          iVar21 = local_9c - iVar15;
          if (iVar15 < local_9c) {
            lVar22 = 0;
            do {
              fVar24 = atan2f((*pafVar14)[lVar22],local_48._0_4_);
              *(float *)((long)*pauVar23 + lVar22 * 4) = fVar24;
              lVar22 = lVar22 + 1;
            } while (iVar21 != (int)lVar22);
          }
          local_90 = local_90 + 1;
        } while (local_90 != local_98);
      }
      break;
    case 0xb:
      local_98 = (long)m->c;
      if (0 < local_98) {
        local_9c = m->h * m->w * m->d * m->elempack;
        local_90 = 0;
        do {
          pafVar14 = (__m128 *)
                     (local_70->cstep * local_90 * local_70->elemsize + (long)local_70->data);
          pauVar23 = (undefined1 (*) [16])
                     (local_78->cstep * local_90 * local_78->elemsize + (long)local_78->data);
          local_58[1] = fStack_64;
          local_58[0] = local_68;
          afStack_50[1] = fStack_5c;
          afStack_50[0] = fStack_60;
          if (local_9c < 4) {
            iVar15 = 0;
          }
          else {
            iVar21 = 0;
            do {
              local_88 = *pafVar14;
              afVar34 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4
                                  (&local_9d,&local_88,(__m128 *)local_58);
              uVar6 = afVar34._0_8_;
              local_88[2] = (float)extraout_XMM0_Dc;
              local_88[0] = (float)(int)uVar6;
              local_88[1] = (float)(int)((ulong)uVar6 >> 0x20);
              local_88[3] = extraout_XMM0_Dd;
              auVar29._8_4_ = extraout_XMM0_Dc;
              auVar29._0_8_ = uVar6;
              auVar29._12_4_ = extraout_XMM0_Dd;
              *pauVar23 = auVar29;
              pafVar14 = pafVar14 + 1;
              pauVar23 = pauVar23 + 1;
              iVar15 = iVar21 + 4;
              iVar20 = iVar21 + 7;
              iVar21 = iVar15;
            } while (iVar20 < local_9c);
          }
          iVar21 = local_9c - iVar15;
          if (iVar15 < local_9c) {
            lVar22 = 0;
            do {
              fVar24 = atan2f((float)local_48._0_4_,(*pafVar14)[lVar22]);
              *(float *)((long)*pauVar23 + lVar22 * 4) = fVar24;
              lVar22 = lVar22 + 1;
            } while (iVar21 != (int)lVar22);
          }
          local_90 = local_90 + 1;
        } while (local_90 != local_98);
      }
    }
  }
  else {
    uVar16 = m->dims;
    uVar3 = pMVar12->dims;
    opt_00 = (Option *)(ulong)uVar3;
    if ((((uVar16 == uVar3) && (m->w == iVar21)) &&
        ((m->h == iVar20 && ((m->d == iVar1 && (m->c == iVar2)))))) && (m->elempack == iVar15)) {
      binary_op_no_broadcast(m,pMVar12,pMVar4,uVar13,opt_00);
    }
    else if (((((int)uVar3 < (int)uVar16) || (((iVar21 == 1 && (uVar16 == 2)) && (iVar20 == m->h))))
             || ((((iVar21 == 1 && (iVar20 == 1)) && ((uVar16 == 3 && (iVar2 == m->c)))) ||
                 ((((iVar21 == 1 && (uVar16 == 3)) && ((iVar20 == m->h && (iVar2 == m->c)))) ||
                  ((((iVar21 == 1 && (iVar20 == 1)) && (iVar1 == 1)) &&
                   ((uVar16 == 4 && (iVar2 == m->c)))))))))) ||
            ((((iVar21 == 1 && ((iVar20 == 1 && (uVar16 == 4)))) &&
              ((iVar1 == m->d && (iVar2 == m->c)))) ||
             ((((iVar21 == 1 && (uVar16 == 4)) && (iVar20 == m->h)) &&
              ((iVar1 == m->d && (iVar2 == m->c)))))))) {
      binary_op_broadcast_inner(m,pMVar12,pMVar4,uVar13,opt_00);
    }
    else {
      if ((iVar15 != 1) ||
         (((((uVar16 != 2 || (iVar20 != 1)) || (iVar21 != m->w)) &&
           ((uVar16 != 3 ||
            ((((iVar2 != 1 || (iVar20 != 1)) || (iVar21 != m->w)) &&
             (((iVar21 != m->w || (iVar2 != 1)) || (iVar20 != m->h)))))))) &&
          ((uVar16 != 4 ||
           ((((iVar2 != 1 || (iVar1 != 1)) || ((iVar20 != 1 || (iVar21 != m->w)))) &&
            (((((iVar21 != m->w || (iVar2 != 1)) || (iVar1 != 1)) || (iVar20 != m->h)) &&
             ((((iVar21 != m->w || (iVar20 != m->h)) || (iVar2 != 1)) || (iVar1 != m->d))))))))))))
      {
        uVar16 = uVar3 ^ 3 | uVar16 ^ 3;
        if (uVar16 != 0) {
          return 0;
        }
        if (iVar20 != 1) {
          return 0;
        }
        if (m->w != iVar21) {
          return 0;
        }
        if (m->c == iVar2) {
          binary_op_broadcast_20(m,pMVar12,pMVar4,uVar13,(Option *)(ulong)uVar16);
          return 0;
        }
        return 0;
      }
      binary_op_broadcast_outer(m,pMVar12,pMVar4,uVar13,opt_00);
    }
  }
  return 0;
}

Assistant:

__m256 func_pack8(const __m256& x, const __m256& y) const
    {
        return atan2256_ps(x, y);
    }